

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O2

void stats_print_atexit(void)

{
  arena_t *arena;
  tsd_t *tsd;
  tcache_slow_t *ptVar1;
  ulong uVar2;
  ulong uVar3;
  long *in_FS_OFFSET;
  
  if (duckdb_je_tsd_booted) {
    tsd = (tsd_t *)(*in_FS_OFFSET + -0x2a90);
    if (*(char *)(*in_FS_OFFSET + -0x2758) != '\0') {
      tsd = duckdb_je_tsd_fetch_slow(tsd,false);
    }
  }
  else {
    tsd = (tsd_t *)0x0;
  }
  uVar3 = (ulong)narenas_total.repr;
  for (uVar2 = 0; uVar2 != uVar3; uVar2 = uVar2 + 1) {
    arena = (arena_t *)duckdb_je_arenas[uVar2].repr;
    if (arena != (arena_t *)0x0) {
      malloc_mutex_lock((tsdn_t *)tsd,&arena->tcache_ql_mtx);
      ptVar1 = (arena->tcache_ql).qlh_first;
      while (ptVar1 != (tcache_slow_t *)0x0) {
        duckdb_je_tcache_stats_merge((tsdn_t *)tsd,ptVar1->tcache,arena);
        ptVar1 = (ptVar1->link).qre_next;
        if (ptVar1 == (arena->tcache_ql).qlh_first) {
          ptVar1 = (tcache_slow_t *)0x0;
        }
      }
      (arena->tcache_ql_mtx).field_0.field_0.locked.repr = false;
      pthread_mutex_unlock((pthread_mutex_t *)((long)&(arena->tcache_ql_mtx).field_0 + 0x48));
    }
  }
  duckdb_je_malloc_stats_print((write_cb_t *)0x0,(void *)0x0,duckdb_je_opt_stats_print_opts);
  return;
}

Assistant:

static void
stats_print_atexit(void) {
	if (config_stats) {
		tsdn_t *tsdn;
		unsigned narenas, i;

		tsdn = tsdn_fetch();

		/*
		 * Merge stats from extant threads.  This is racy, since
		 * individual threads do not lock when recording tcache stats
		 * events.  As a consequence, the final stats may be slightly
		 * out of date by the time they are reported, if other threads
		 * continue to allocate.
		 */
		for (i = 0, narenas = narenas_total_get(); i < narenas; i++) {
			arena_t *arena = arena_get(tsdn, i, false);
			if (arena != NULL) {
				tcache_slow_t *tcache_slow;

				malloc_mutex_lock(tsdn, &arena->tcache_ql_mtx);
				ql_foreach(tcache_slow, &arena->tcache_ql,
				    link) {
					tcache_stats_merge(tsdn,
					    tcache_slow->tcache, arena);
				}
				malloc_mutex_unlock(tsdn,
				    &arena->tcache_ql_mtx);
			}
		}
	}
	je_malloc_stats_print(NULL, NULL, opt_stats_print_opts);
}